

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

disp_binding_activator_t * __thiscall
so_5::disp::active_group::impl::binding_actions_t::do_bind
          (disp_binding_activator_t *__return_storage_ptr__,binding_actions_t *this,
          actual_disp_iface_t *disp,agent_ref_t *agent)

{
  int iVar1;
  undefined4 extraout_var;
  binding_actions_t *in_R9;
  anon_class_16_2_07130beb main_action;
  anon_class_16_2_3f0559d5 rollback_action;
  agent_ref_t local_30;
  event_queue_t *ctx;
  agent_ref_t *agent_local;
  actual_disp_iface_t *disp_local;
  binding_actions_t *this_local;
  
  ctx = (event_queue_t *)agent;
  agent_local = (agent_ref_t *)disp;
  disp_local = (actual_disp_iface_t *)this;
  this_local = (binding_actions_t *)__return_storage_ptr__;
  iVar1 = (*(disp->super_dispatcher_t)._vptr_dispatcher_t[6])();
  local_30.m_obj = (agent_t *)CONCAT44(extraout_var,iVar1);
  main_action.ctx = (event_queue_t **)agent_local;
  main_action.agent = &local_30;
  rollback_action.this = in_R9;
  rollback_action.disp = (actual_disp_iface_t *)this;
  details::
  do_with_rollback_on_exception<so_5::disp::active_group::impl::binding_actions_t::do_bind(so_5::disp::active_group::impl::actual_disp_iface_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_1_,so_5::disp::active_group::impl::binding_actions_t::do_bind(so_5::disp::active_group::impl::actual_disp_iface_t&,so_5::intrusive_ptr_t<so_5::agent_t>)::_lambda()_2_>
            (__return_storage_ptr__,(details *)agent,main_action,rollback_action);
  return __return_storage_ptr__;
}

Assistant:

so_5::disp_binding_activator_t
		do_bind(
			actual_disp_iface_t & disp,
			so_5::agent_ref_t agent )
			{
				auto ctx = disp.query_thread_for_group( m_group_name );

				return so_5::details::do_with_rollback_on_exception(
						[&] {
							return so_5::disp_binding_activator_t {
								[agent, ctx]() {
									agent->so_bind_to_dispatcher( *ctx );
								} };
						},
						[&] {
							// Dispatcher for the agent should be removed.
							disp.release_thread_for_group( m_group_name );
						} );
			}